

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O2

ArrayRef<double> * __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::RecomputeAuxVars(ArrayRef<double> *__return_storage_ptr__,
                  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,ArrayRef<double> *x,vector<bool,_std::allocator<bool>_> *is_final)

{
  VarVecRecomp *this_00;
  double ft;
  int i;
  _Vector_base<double,_std::allocator<double>_> local_2c8;
  function<double_(int,_const_mp::VarInfoRecomp_&)> local_2b0;
  _Bvector_base<std::allocator<bool>_> local_290;
  ArrayRef<double> local_268;
  ArrayRef<double> local_238;
  ArrayRef<mp::var::Type> local_208;
  ArrayRef<double> local_1d8;
  VarVecRecomp local_1a8;
  VarInfoRecomp vir;
  
  ft = *(double *)((long)&this[7].recomp_fn.super__Function_base._M_functor + 8);
  ArrayRef::operator_cast_to_vector
            ((vector<double,_std::allocator<double>_> *)&local_2c8,(ArrayRef *)x);
  std::function<double_(int,_const_mp::VarInfoRecomp_&)>::function(&local_2b0,&this->recomp_fn);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_290,is_final);
  VarVecRecomp::VarVecRecomp
            (&local_1a8,(vector<double,_std::allocator<double>_> *)&local_2c8,&local_2b0,
             (vector<bool,_std::allocator<bool>_> *)&local_290);
  local_1d8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.data_ = (double *)0x0;
  local_1d8.size_ = 0;
  local_208.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.data_ = (Type *)this[-0xe].recomp_fn.super__Function_base._M_manager;
  local_208.size_ = (long)this[-0xe].recomp_fn._M_invoker - (long)local_208.data_ >> 2;
  local_238.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.data_ = (double *)this[-0x11].recomp_fn.super__Function_base._M_manager;
  local_238.size_ = (long)this[-0x11].recomp_fn._M_invoker - (long)local_238.data_ >> 3;
  local_268.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.data_ = *(double **)((long)&this[-0x10].recomp_fn.super__Function_base._M_functor + 8);
  local_268.size_ =
       (long)this[-0x10].recomp_fn.super__Function_base._M_manager - (long)local_268.data_ >> 3;
  VarInfoImpl<mp::VarVecRecomp>::VarInfoImpl
            (&vir.super_VarInfoRecompTypedef,ft,true,&local_1a8,&local_1d8,&local_208,&local_238,
             &local_268,*(int *)&this[8].recomp_fn.super__Function_base._M_functor,
             *(int *)((long)&this[8].recomp_fn.super__Function_base._M_functor + 4));
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_268);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_238);
  std::_Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>::~_Vector_base
            ((_Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_> *)&local_208);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_1d8);
  VarVecRecomp::~VarVecRecomp(&local_1a8);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_290);
  std::_Function_base::~_Function_base(&local_2b0.super__Function_base);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2c8);
  this_00 = &vir.super_VarInfoRecompTypedef.x_;
  i = (int)((ulong)((long)vir.super_VarInfoRecompTypedef.x_.x_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)vir.super_VarInfoRecompTypedef.x_.x_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3);
  vir.super_VarInfoRecompTypedef.x_.p_var_info_recomp_ =
       (VarInfoRecomp *)&vir.super_VarInfoRecompTypedef;
  while (i = i + -1, i != -1) {
    VarVecRecomp::operator[](this_00,i);
  }
  ArrayRef<double>::ArrayRef(__return_storage_ptr__,&this_00->x_);
  VarInfoImpl<mp::VarVecRecomp>::~VarInfoImpl(&vir.super_VarInfoRecompTypedef);
  return __return_storage_ptr__;
}

Assistant:

ArrayRef<double> RecomputeAuxVars(
      ArrayRef<double> x, std::vector<bool> is_final={}) {
    VarInfoRecomp vir {
      MPCD( sol_feas_tol() ),
          true,        // currently not relevant for recomputation
      {x, recomp_fn, is_final},
      {},              // no raw values
      MPCD( GetModel() ).var_type_vec(),
          MPCD( GetModel() ).var_lb_vec(),
          MPCD( GetModel() ).var_ub_vec(),
          MPCD( sol_round() ), MPCD( sol_prec() )
    };
    vir.get_x().set_p_var_info(&vir);
    for (auto i=vir.size(); i--; )
      vir[i];         // touch the variable to be recomputed
    return std::move(vir.get_x().get_x());
  }